

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

size_t duckdb_snappy::Compress
                 (char *input,size_t input_length,string *compressed,CompressionOptions options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong in_RAX;
  pointer compressed_00;
  size_t compressed_length;
  ulong local_38;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = input_length;
  auVar2._8_8_ = 4;
  auVar2._0_8_ = 0xaaaaaaaaaaaaaaab;
  compressed_00 = (char *)0x0;
  local_38 = in_RAX;
  std::__cxx11::string::resize((ulong)compressed,(char)(SUB168(auVar1 * auVar2,8) >> 2) + ' ');
  if (compressed->_M_string_length != 0) {
    compressed_00 = (compressed->_M_dataplus)._M_p;
  }
  RawCompress(input,input_length,compressed_00,&local_38,options);
  if (local_38 <= compressed->_M_string_length) {
    compressed->_M_string_length = local_38;
    (compressed->_M_dataplus)._M_p[local_38] = '\0';
    return local_38;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",local_38
            );
}

Assistant:

size_t Compress(const char* input, size_t input_length, std::string* compressed,
                CompressionOptions options) {
  // Pre-grow the buffer to the max length of the compressed output
  STLStringResizeUninitialized(compressed, MaxCompressedLength(input_length));

  size_t compressed_length;
  RawCompress(input, input_length, string_as_array(compressed),
              &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}